

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O3

void __thiscall libtorrent::cached_piece_entry::~cached_piece_entry(cached_piece_entry *this)

{
  _Head_base<0UL,_libtorrent::cached_block_entry_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  node_ptr plVar2;
  node_ptr plVar3;
  
  _Var1._M_head_impl =
       (this->blocks).
       super_unique_ptr<libtorrent::cached_block_entry[],_std::default_delete<libtorrent::cached_block_entry[]>_>
       ._M_t.
       super___uniq_ptr_impl<libtorrent::cached_block_entry,_std::default_delete<libtorrent::cached_block_entry[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::cached_block_entry_*,_std::default_delete<libtorrent::cached_block_entry[]>_>
       .super__Head_base<0UL,_libtorrent::cached_block_entry_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (cached_block_entry *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  (this->blocks).
  super_unique_ptr<libtorrent::cached_block_entry[],_std::default_delete<libtorrent::cached_block_entry[]>_>
  ._M_t.
  super___uniq_ptr_impl<libtorrent::cached_block_entry,_std::default_delete<libtorrent::cached_block_entry[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::cached_block_entry_*,_std::default_delete<libtorrent::cached_block_entry[]>_>
  .super__Head_base<0UL,_libtorrent::cached_block_entry_*,_false>._M_head_impl =
       (cached_block_entry *)0x0;
  std::unique_ptr<libtorrent::partial_hash,_std::default_delete<libtorrent::partial_hash>_>::
  ~unique_ptr(&this->hash);
  this_00 = (this->storage).
            super___shared_ptr<libtorrent::storage_interface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  plVar2 = (this->
           super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>).
           super_type.super_type.super_list_node<void_*>.next_;
  if (plVar2 != (node_ptr)0x0) {
    plVar3 = (this->
             super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>
             ).super_type.super_type.super_list_node<void_*>.prev_;
    plVar3->next_ = plVar2;
    plVar2->prev_ = plVar3;
    (this->super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>).
    super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
    (this->super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>).
    super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  }
  return;
}

Assistant:

cached_piece_entry::~cached_piece_entry()
{
	TORRENT_ASSERT(piece_refcount == 0);
	TORRENT_ASSERT(jobs.empty());
	TORRENT_ASSERT(read_jobs.empty());
#if TORRENT_USE_ASSERTS
	if (blocks)
	{
		for (int i = 0; i < blocks_in_piece; ++i)
		{
			TORRENT_ASSERT(!blocks[i].pending);
			TORRENT_ASSERT(blocks[i].refcount == 0);
			TORRENT_ASSERT(blocks[i].hashing_count == 0);
			TORRENT_ASSERT(blocks[i].flushing_count == 0);
		}
	}
	in_use = false;
#endif
}